

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

bool __thiscall
pbrt::Curve::RecursiveIntersect
          (Curve *this,Ray *ray,Float tMax,span<const_pbrt::Point3<float>_> cp,
          Transform *ObjectFromRay,Float u0,Float u1,int depth,optional<pbrt::ShapeIntersection> *si
          )

{
  Float FVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  CurveCommon *pCVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  bool bVar18;
  Point3<float> *pPVar19;
  Point3<float> *pPVar20;
  Interval<float> *this_00;
  long lVar21;
  SurfaceInteraction *pSVar22;
  long in_FS_OFFSET;
  undefined8 uVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar36 [48];
  undefined1 auVar34 [64];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar51 [56];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar52 [16];
  undefined1 auVar54 [12];
  undefined1 in_register_00001244 [60];
  undefined1 auVar55 [60];
  undefined1 auVar53 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_register_00001284 [60];
  undefined1 auVar58 [64];
  float fVar59;
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar63;
  float fVar65;
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  span<const_pbrt::Point3<float>_> cp_00;
  span<const_pbrt::Point3<float>_> cp_01;
  span<const_pbrt::Point3<float>_> cp_02;
  Point3<float> PVar69;
  Vector3<float> VVar70;
  uint local_328;
  float local_308;
  Tuple3<pbrt::Vector3,_float> local_2e8;
  Tuple3<pbrt::Normal3,_float> local_2d8;
  undefined1 local_2c8 [16];
  Transform *local_2b0;
  Float local_2a4;
  float local_2a0;
  float local_29c;
  undefined1 local_298 [16];
  Point3fi pi;
  Tuple3<pbrt::Vector3,_float> local_270;
  undefined8 local_260;
  undefined4 local_258;
  Point2f local_250;
  Tuple3<pbrt::Normal3,_float> local_248;
  Tuple3<pbrt::Normal3,_float> local_238;
  Vector3f pError;
  Float u [3];
  float fStack_214;
  Interval<float> IStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  Tuple3<pbrt::Normal3,_float> aTStack_1f8 [2];
  MediumInterface *local_1e0;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_1d8;
  Tuple3<pbrt::Vector3,_float> local_1d0 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_1b8 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_1a0 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_188 [2];
  Tuple3<pbrt::Normal3,_float> TStack_170;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  local_160;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_158;
  Tuple3<pbrt::Vector3,_float> local_150 [3];
  SurfaceInteraction intr;
  undefined1 auVar31 [16];
  undefined1 auVar35 [64];
  
  auVar36 = in_ZmmResult._16_48_;
  auVar58._4_60_ = in_register_00001284;
  auVar58._0_4_ = u1;
  auVar27 = auVar58._0_16_;
  auVar60._4_60_ = in_register_00001244;
  auVar60._0_4_ = u0;
  pPVar19 = (Point3<float> *)cp.n;
  this_00 = (Interval<float> *)cp.ptr;
  fVar40 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar25 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40)),auVar25,auVar25);
  auVar26 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z);
  auVar25 = vfmadd213ss_fma(auVar26,auVar26,auVar25);
  pPVar20 = pPVar19;
  local_2b0 = ObjectFromRay;
  if (auVar25._0_4_ < 0.0) {
    fVar40 = sqrtf(auVar25._0_4_);
    auVar27 = ZEXT416((uint)u1);
  }
  else {
    auVar25 = vsqrtss_avx(auVar25,auVar25);
    fVar40 = auVar25._0_4_;
  }
  u[2] = auVar27._0_4_;
  if (depth < 1) {
    fVar38 = this_00->low;
    fVar39 = this_00->high;
    auVar25 = vfnmadd231ss_fma(ZEXT416((uint)(fVar38 * (fVar38 - this_00[1].high))),
                               ZEXT416((uint)fVar39),ZEXT416((uint)(this_00[2].low - fVar39)));
    if (0.0 <= auVar25._0_4_) {
      fVar37 = this_00[5].low;
      fVar12 = this_00[4].high;
      auVar25 = vfnmadd231ss_fma(ZEXT416((uint)(fVar12 * (fVar12 - this_00[3].low))),
                                 ZEXT416((uint)fVar37),ZEXT416((uint)(this_00[3].high - fVar37)));
      if (0.0 <= auVar25._0_4_) {
        fVar12 = fVar12 - fVar38;
        fVar37 = fVar37 - fVar39;
        fVar59 = fVar37 * fVar37 + fVar12 * fVar12;
        if ((fVar59 != 0.0) || (NAN(fVar59))) {
          auVar25._8_4_ = 0x80000000;
          auVar25._0_8_ = 0x8000000080000000;
          auVar25._12_4_ = 0x80000000;
          auVar25 = vxorps_avx512vl(ZEXT416((uint)fVar39),auVar25);
          auVar28 = ZEXT416((uint)(fVar37 * auVar25._0_4_));
          auVar26 = vfnmadd213ss_fma(ZEXT416((uint)fVar12),ZEXT416((uint)fVar38),auVar28);
          auVar25 = vfmsub213ss_fma(ZEXT416((uint)fVar37),auVar25,auVar28);
          fVar59 = (auVar26._0_4_ + auVar25._0_4_) / fVar59;
          auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * u[2])),auVar60._0_16_,
                                    ZEXT416((uint)(1.0 - fVar59)));
          auVar25 = vminss_avx(auVar27,auVar26);
          uVar23 = vcmpss_avx512f(auVar26,auVar60._0_16_,1);
          bVar18 = (bool)((byte)uVar23 & 1);
          auVar35._16_48_ = auVar36;
          auVar35._0_16_ = auVar25;
          auVar34._4_60_ = auVar35._4_60_;
          auVar34._0_4_ = (float)((uint)bVar18 * (int)u0 + (uint)!bVar18 * auVar25._0_4_);
          local_298 = auVar34._0_16_;
          pCVar10 = this->common;
          auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ * pCVar10->width[1])),
                                    ZEXT416((uint)(1.0 - auVar34._0_4_)),
                                    ZEXT416((uint)pCVar10->width[0]));
          local_308 = auVar25._0_4_;
          local_2d8.x = 0.0;
          local_2d8.y = 0.0;
          local_2d8.z = 0.0;
          if (pCVar10->type == Ribbon) {
            local_2c8._0_4_ = fVar59;
            fVar38 = sinf((1.0 - auVar34._0_4_) * pCVar10->normalAngle);
            fVar38 = fVar38 * this->common->invSinNormalAngle;
            fVar39 = sinf((float)local_298._0_4_ * this->common->normalAngle);
            pCVar10 = this->common;
            fVar39 = fVar39 * pCVar10->invSinNormalAngle;
            local_2d8.z = fVar38 * pCVar10->n[0].super_Tuple3<pbrt::Normal3,_float>.z +
                          fVar39 * pCVar10->n[1].super_Tuple3<pbrt::Normal3,_float>.z;
            uVar2 = pCVar10->n[0].super_Tuple3<pbrt::Normal3,_float>.x;
            uVar6 = pCVar10->n[0].super_Tuple3<pbrt::Normal3,_float>.y;
            uVar3 = pCVar10->n[1].super_Tuple3<pbrt::Normal3,_float>.x;
            uVar7 = pCVar10->n[1].super_Tuple3<pbrt::Normal3,_float>.y;
            auVar27._0_4_ = fVar38 * (float)uVar2 + fVar39 * (float)uVar3;
            auVar27._4_4_ = fVar38 * (float)uVar6 + fVar39 * (float)uVar7;
            auVar27._8_4_ = fVar38 * 0.0 + fVar39 * 0.0;
            auVar27._12_4_ = fVar38 * 0.0 + fVar39 * 0.0;
            local_2d8._0_8_ = vmovlps_avx(auVar27);
            fVar38 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
            auVar26 = ZEXT416((uint)(local_2d8.z * fVar38));
            auVar25 = vfmadd132ss_fma(ZEXT416((uint)local_2d8.y),auVar26,
                                      ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.y));
            auVar26 = vfmsub213ss_fma(ZEXT416((uint)fVar38),ZEXT416((uint)local_2d8.z),auVar26);
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_)),
                                      ZEXT416((uint)local_2d8.x),
                                      ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x));
            auVar26._8_4_ = 0x7fffffff;
            auVar26._0_8_ = 0x7fffffff7fffffff;
            auVar26._12_4_ = 0x7fffffff;
            auVar25 = vandps_avx512vl(auVar25,auVar26);
            local_308 = local_308 * (auVar25._0_4_ / fVar40);
            fVar59 = (float)local_2c8._0_4_;
          }
          local_260 = 0;
          local_258 = 0;
          auVar25 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar59));
          auVar54 = SUB1612(ZEXT816(0) << 0x40,4);
          uVar23 = vcmpss_avx512f(ZEXT416((uint)fVar59),ZEXT816(0) << 0x40,1);
          auVar51 = ZEXT856(auVar25._8_8_);
          cp_01.n = (size_t)&local_260;
          cp_01.ptr = pPVar19;
          PVar69 = EvaluateCubicBezier<pbrt::Point3<float>,pbrt::Vector3<float>>
                             ((pbrt *)this_00,cp_01,
                              (Float)((uint)!(bool)((byte)uVar23 & 1) * auVar25._0_4_),
                              (Vector3<float> *)pPVar20);
          fVar39 = PVar69.super_Tuple3<pbrt::Point3,_float>.z;
          auVar47._0_8_ = PVar69.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar47._8_56_ = auVar51;
          auVar26 = auVar47._0_16_;
          auVar25 = vmovshdup_avx(auVar26);
          auVar26 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ * auVar25._0_4_)),auVar26,auVar26);
          fVar38 = auVar26._0_4_;
          if (fVar38 <= local_308 * local_308 * 0.25) {
            if (fVar39 < 0.0) {
              return false;
            }
            if (fVar40 * tMax < fVar39) {
              return false;
            }
            if (si != (optional<pbrt::ShapeIntersection> *)0x0) {
              local_2c8._0_4_ = fVar39 / fVar40;
              local_2c8._4_12_ = auVar54;
              if ((si->set == true) &&
                 (*(float *)((long)&si->optionalValue + 0xf8) < (float)local_2c8._0_4_)) {
                return false;
              }
              if (fVar38 < 0.0) {
                fVar40 = sqrtf(fVar38);
              }
              else {
                auVar26 = vsqrtss_avx(auVar26,auVar26);
                fVar40 = auVar26._0_4_;
              }
              auVar25 = vfnmadd132ss_fma(auVar25,ZEXT416((uint)(PVar69.
                                                  super_Tuple3<pbrt::Point3,_float>.x *
                                                  local_260._4_4_)),ZEXT416((uint)local_260));
              local_270.x = 0.0;
              local_270.y = 0.0;
              local_270.z = 0.0;
              local_2e8.x = 0.0;
              local_2e8.y = 0.0;
              local_2e8.z = 0.0;
              cp_02.n = (size_t)&local_270;
              cp_02.ptr = (Point3<float> *)0x4;
              EvaluateCubicBezier<pbrt::Point3<float>,pbrt::Vector3<float>>
                        ((pbrt *)this->common->cpObj,cp_02,(Float)local_298._0_4_,
                         (Vector3<float> *)pPVar20);
              intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = 0.0;
              intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = 0.0;
              intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = 0.0;
              u[0] = local_270.x;
              u[1] = local_270.y;
              uVar23 = u._0_8_;
              u[2] = local_270.z;
              u[0] = local_270.x;
              u._0_8_ = uVar23;
              if ((((u[0] == 0.0) && (!NAN(u[0]))) && (u[1] = local_270.y, u[1] == 0.0)) &&
                 ((local_270.z == 0.0 && (!NAN(local_270.z))))) {
                LogFatal<char_const(&)[18],char_const(&)[5],char_const(&)[18],pbrt::Vector3<float>&,char_const(&)[5],pbrt::Vector3<float>&>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes.cpp"
                           ,0x2aa,"Check failed: %s != %s with %s = %s, %s = %s",
                           (char (*) [18])"Vector3f(0, 0, 0)",(char (*) [5])"dpdu",
                           (char (*) [18])"Vector3f(0, 0, 0)",(Vector3<float> *)&intr,
                           (char (*) [5])"dpdu",(Vector3<float> *)u);
              }
              auVar29._0_4_ = fVar40 / local_308;
              auVar29._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar26 = vxorps_avx512vl(auVar29,auVar28);
              local_328 = auVar25._0_4_;
              uVar23 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416(local_328),1);
              bVar18 = (bool)((byte)uVar23 & 1);
              auVar55 = ZEXT1260(auVar26._4_12_);
              fVar40 = (float)((uint)bVar18 * (int)auVar29._0_4_ + (uint)!bVar18 * auVar26._0_4_) +
                       0.5;
              auVar51 = (undefined1  [56])0x0;
              if (this->common->type == Ribbon) {
                VVar70 = Cross<float>((Normal3<float> *)&local_2d8,(Vector3<float> *)&local_270);
                auVar53._0_4_ = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar53._4_60_ = auVar55;
                auVar48._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar48._8_56_ = auVar51;
                auVar26 = auVar48._0_16_;
                auVar41._0_4_ =
                     VVar70.super_Tuple3<pbrt::Vector3,_float>.x *
                     VVar70.super_Tuple3<pbrt::Vector3,_float>.x;
                auVar41._4_4_ =
                     VVar70.super_Tuple3<pbrt::Vector3,_float>.y *
                     VVar70.super_Tuple3<pbrt::Vector3,_float>.y;
                auVar41._8_4_ = auVar51._0_4_ * auVar51._0_4_;
                auVar41._12_4_ = auVar51._4_4_ * auVar51._4_4_;
                auVar25 = vmovshdup_avx(auVar41);
                auVar25 = vfmadd231ss_fma(auVar25,auVar26,auVar26);
                auVar25 = vfmadd231ss_fma(auVar25,auVar53._0_16_,auVar53._0_16_);
                if (auVar25._0_4_ < 0.0) {
                  fVar38 = sqrtf(auVar25._0_4_);
                  auVar53 = ZEXT464((uint)auVar53._0_4_);
                }
                else {
                  auVar25 = vsqrtss_avx(auVar25,auVar25);
                  fVar38 = auVar25._0_4_;
                }
                auVar42._4_4_ = fVar38;
                auVar42._0_4_ = fVar38;
                auVar42._8_4_ = fVar38;
                auVar42._12_4_ = fVar38;
                auVar25 = vdivps_avx(auVar26,auVar42);
                auVar43._0_4_ = local_308 * auVar25._0_4_;
                auVar43._4_4_ = local_308 * auVar25._4_4_;
                auVar43._8_4_ = local_308 * auVar25._8_4_;
                auVar43._12_4_ = local_308 * auVar25._12_4_;
                local_2e8.z = local_308 * (auVar53._0_4_ / fVar38);
                local_2e8._0_8_ = vmovlps_avx(auVar43);
              }
              else {
                VVar70 = Transform::ApplyInverse<float>(local_2b0,(Vector3<float> *)&local_270);
                u[2] = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar49._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar49._8_56_ = auVar51;
                u._0_8_ = vmovlps_avx(auVar49._0_16_);
                FVar1 = u[0];
                auVar30._8_4_ = 0x80000000;
                auVar30._0_8_ = 0x8000000080000000;
                auVar30._12_4_ = 0x80000000;
                auVar26 = vxorps_avx512vl(ZEXT416((uint)u[1]),auVar30);
                auVar25 = vfmadd231ss_fma(ZEXT416((uint)(u[0] * u[0])),ZEXT416((uint)u[1]),
                                          ZEXT416((uint)u[1]));
                if (auVar25._0_4_ < 0.0) {
                  fVar38 = sqrtf(auVar25._0_4_);
                }
                else {
                  auVar25 = vsqrtss_avx(auVar25,auVar25);
                  fVar38 = auVar25._0_4_;
                }
                auVar25 = vinsertps_avx(auVar26,ZEXT416((uint)FVar1),0x10);
                auVar44._4_4_ = fVar38;
                auVar44._0_4_ = fVar38;
                auVar44._8_4_ = fVar38;
                auVar44._12_4_ = fVar38;
                auVar25 = vdivps_avx(auVar25,auVar44);
                auVar45._0_4_ = local_308 * auVar25._0_4_;
                auVar45._4_4_ = local_308 * auVar25._4_4_;
                auVar45._8_4_ = local_308 * auVar25._8_4_;
                auVar45._12_4_ = local_308 * auVar25._12_4_;
                auVar51 = ZEXT856(auVar45._8_8_);
                pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low =
                     local_308 * (0.0 / fVar38);
                pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
                     (Interval<float>)vmovlps_avx(auVar45);
                if (this->common->type == Cylinder) {
                  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * 90.0)),
                                            ZEXT416((uint)(1.0 - fVar40)),ZEXT416(0xc2b40000));
                  fVar38 = auVar25._0_4_ * -0.017453292;
                  fVar39 = sinf(fVar38);
                  fVar38 = cosf(fVar38);
                  Rotate((Transform *)&intr,fVar39,fVar38,(Vector3f *)u);
                  auVar51 = (undefined1  [56])0x0;
                  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(pi.super_Point3<pbrt::Interval<float>_>.
                                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high * intr.super_Interaction.pi.
                                                            super_Point3<pbrt::Interval<float>_>.
                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high)),
                                            ZEXT416((uint)pi.super_Point3<pbrt::Interval<float>_>.
                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low),
                                            ZEXT416((uint)intr.super_Interaction.pi.
                                                          super_Point3<pbrt::Interval<float>_>.
                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low));
                  auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)pi.
                                                  super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low),
                                            ZEXT416((uint)intr.super_Interaction.pi.
                                                          super_Point3<pbrt::Interval<float>_>.
                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low));
                  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(pi.super_Point3<pbrt::Interval<float>_>.
                                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high * intr.super_Interaction.pi.
                                                            super_Point3<pbrt::Interval<float>_>.
                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.high)),
                                            ZEXT416((uint)pi.super_Point3<pbrt::Interval<float>_>.
                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low),
                                            ZEXT416((uint)intr.super_Interaction.pi.
                                                          super_Point3<pbrt::Interval<float>_>.
                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .z.low));
                  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)pi.
                                                  super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low),ZEXT416((uint)intr.super_Interaction.time)
                                           );
                  auVar25 = vinsertps_avx(auVar25,auVar26,0x10);
                  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(pi.super_Point3<pbrt::Interval<float>_>.
                                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high * intr.super_Interaction.wo.
                                                            super_Tuple3<pbrt::Vector3,_float>.z)),
                                            ZEXT416((uint)pi.super_Point3<pbrt::Interval<float>_>.
                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low),
                                            ZEXT416((uint)intr.super_Interaction.wo.
                                                          super_Tuple3<pbrt::Vector3,_float>.y));
                  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)pi.
                                                  super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low),
                                            ZEXT416((uint)intr.super_Interaction.n.
                                                          super_Tuple3<pbrt::Normal3,_float>.x));
                  pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
                       (Interval<float>)vmovlps_avx(auVar25);
                  pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = auVar26._0_4_;
                }
                VVar70 = Transform::operator()(local_2b0,(Vector3<float> *)&pi);
                local_2e8.z = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar50._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar50._8_56_ = auVar51;
                local_2e8._0_8_ = vmovlps_avx(auVar50._0_16_);
              }
              pError.super_Tuple3<pbrt::Vector3,_float>.x = local_308 + local_308;
              bVar18 = this->common->reverseOrientation;
              bVar11 = this->common->transformSwapsHandedness;
              uVar4 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
              uVar8 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
              uVar5 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
              uVar9 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
              auVar52._0_4_ = (float)local_2c8._0_4_ * (float)uVar5 + (float)uVar4;
              auVar52._4_4_ = (float)local_2c8._0_4_ * (float)uVar9 + (float)uVar8;
              auVar52._8_4_ = (float)local_2c8._0_4_ * 0.0 + 0.0;
              auVar52._12_4_ = (float)local_2c8._0_4_ * 0.0 + 0.0;
              intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low =
                   (float)local_2c8._0_4_ * (ray->d).super_Tuple3<pbrt::Vector3,_float>.z +
                   (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
              intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
                   (Interval<float>)vmovlps_avx(auVar52);
              pError.super_Tuple3<pbrt::Vector3,_float>.y =
                   pError.super_Tuple3<pbrt::Vector3,_float>.x;
              pError.super_Tuple3<pbrt::Vector3,_float>.z =
                   pError.super_Tuple3<pbrt::Vector3,_float>.x;
              Point3fi::Point3fi(&pi,(Point3f *)&intr,&pError);
              local_250.super_Tuple2<pbrt::Point2,_float>.x = (float)local_298._0_4_;
              uVar15._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
              uVar15._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
              auVar46._0_8_ = uVar15 ^ 0x8000000080000000;
              auVar46._8_4_ = 0x80000000;
              auVar46._12_4_ = 0x80000000;
              u[2] = -(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
              u._0_8_ = vmovlps_avx(auVar46);
              local_238.z = 0.0;
              local_238.x = 0.0;
              local_238.y = 0.0;
              local_248.z = 0.0;
              local_248.x = 0.0;
              local_248.y = 0.0;
              local_250.super_Tuple2<pbrt::Point2,_float>.y = fVar40;
              SurfaceInteraction::SurfaceInteraction
                        (&intr,&pi,&local_250,(Vector3f *)u,(Vector3f *)&local_270,
                         (Vector3f *)&local_2e8,(Normal3f *)&local_238,(Normal3f *)&local_248,
                         ray->time,bVar18 != bVar11);
              Transform::operator()((SurfaceInteraction *)u,this->common->renderFromObject,&intr);
              if (si->set == true) {
                si->set = false;
              }
              *(MediumInterface **)((long)&si->optionalValue + 0x40) = local_1e0;
              (si->optionalValue).__align = (anon_struct_8_0_00000001_for___align)u._0_8_;
              *(ulong *)((long)&si->optionalValue + 8) = CONCAT44(fStack_214,u[2]);
              *(Interval<float> *)((long)&si->optionalValue + 0x10) = IStack_210;
              *(undefined8 *)((long)&si->optionalValue + 0x18) = uStack_208;
              *(undefined8 *)((long)&si->optionalValue + 0x20) = uStack_200;
              *(undefined8 *)((long)&si->optionalValue + 0x28) = aTStack_1f8[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x30) = aTStack_1f8._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x38) = aTStack_1f8[1]._4_8_;
              ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                *)((long)&si->optionalValue + 0x48))->bits = local_1d8.bits;
              *(undefined8 *)((long)&si->optionalValue + 0x50) = local_1d0[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x58) = local_1d0._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x60) = local_1d0[1]._4_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x68) = aTStack_1b8[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x70) = aTStack_1b8._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x78) = aTStack_1b8[1]._4_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x80) = aTStack_1a0[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x88) = aTStack_1a0._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x80) = aTStack_1a0[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x88) = aTStack_1a0._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x90) = aTStack_1a0[1]._4_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x98) = aTStack_188[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xa0) = aTStack_188._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xa8) = aTStack_188[1]._4_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xb0) = TStack_170._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xb8) = stack0xfffffffffffffe98;
              ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                *)((long)&si->optionalValue + 0xc0))->bits = local_160.bits;
              ((TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                *)((long)&si->optionalValue + 200))->bits = local_158.bits;
              *(undefined8 *)((long)&si->optionalValue + 0xd0) = local_150[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xd8) = local_150._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xe0) = local_150[1]._4_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xe8) = local_150[2]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xf0) = stack0xfffffffffffffed0;
              *(undefined4 *)((long)&si->optionalValue + 0xf8) = local_2c8._0_4_;
              si->set = true;
            }
            *(long *)(in_FS_OFFSET + -0x460) = *(long *)(in_FS_OFFSET + -0x460) + 1;
            return true;
          }
        }
      }
    }
  }
  else {
    fVar40 = this_00[1].low;
    fVar38 = this_00[2].high;
    fVar39 = this_00[4].low;
    fVar37 = this_00[5].high;
    auVar25 = vaddss_avx512f(ZEXT416((uint)fVar38),ZEXT416((uint)(fVar39 + fVar39)));
    auVar26 = vmulss_avx512f(ZEXT416((uint)fVar38),SUB6416(ZEXT464(0x40400000),0));
    auVar29 = ZEXT416((uint)fVar38);
    auVar27 = vaddss_avx512f(auVar29,auVar29);
    auVar27 = vmulss_avx512f(ZEXT416((uint)(fVar39 + fVar40 + auVar27._0_4_)),
                             SUB6416(ZEXT464(0x3e800000),0));
    fVar13 = (float)*(undefined8 *)&this_00[1].high;
    fVar14 = (float)((ulong)*(undefined8 *)&this_00[1].high >> 0x20);
    fVar38 = (*this_00).low;
    fVar59 = (*this_00).high;
    fVar12 = (float)*(undefined8 *)&this_00[4].high;
    fVar62 = this_00[3].low;
    fVar63 = (float)((ulong)*(undefined8 *)&this_00[4].high >> 0x20);
    fVar65 = this_00[3].high;
    auVar68._0_4_ = (fVar62 + fVar12) * 0.5;
    auVar68._4_4_ = (fVar65 + fVar63) * 0.5;
    auVar68._8_8_ = 0;
    auVar67._0_4_ = (fVar62 + fVar62 + fVar13 + fVar12) * 0.25;
    auVar67._4_4_ = (fVar65 + fVar65 + fVar14 + fVar63) * 0.25;
    auVar67._8_8_ = 0;
    auVar66._0_4_ = fVar13 * 3.0 + fVar38 + fVar62 * 3.0 + fVar12;
    auVar66._4_4_ = fVar14 * 3.0 + fVar59 + fVar65 * 3.0 + fVar63;
    auVar66._8_8_ = 0;
    auVar17._8_4_ = 0x3e000000;
    auVar17._0_8_ = 0x3e0000003e000000;
    auVar17._12_4_ = 0x3e000000;
    auVar28 = vmulps_avx512vl(auVar66,auVar17);
    auVar64._0_4_ = (fVar13 + fVar13 + fVar38 + fVar62) * 0.25;
    auVar64._4_4_ = (fVar14 + fVar14 + fVar59 + fVar65) * 0.25;
    auVar64._8_8_ = 0;
    auVar61._0_4_ = (fVar38 + fVar13) * 0.5;
    auVar61._4_4_ = (fVar59 + fVar14) * 0.5;
    auVar61._8_8_ = 0;
    auVar29 = vaddss_avx512f(ZEXT416((uint)fVar40),auVar29);
    pSVar22 = &intr;
    intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = *this_00;
    intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = this_00[1].low;
    uVar23 = vmovlps_avx(auVar61);
    intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = (float)uVar23;
    intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = (float)((ulong)uVar23 >> 0x20);
    intr.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = auVar29._0_4_ * 0.5;
    uVar23 = vmovlps_avx(auVar64);
    intr.super_Interaction.time = (Float)uVar23;
    intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar23 >> 0x20);
    intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = auVar27._0_4_;
    uVar23 = vmovlps_avx(auVar28);
    intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = (float)uVar23;
    intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)((ulong)uVar23 >> 0x20);
    intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y =
         (auVar26._0_4_ + fVar40 + fVar39 * 3.0 + fVar37) * 0.125;
    uVar23 = vmovlps_avx(auVar67);
    intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)uVar23;
    intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)((ulong)uVar23 >> 0x20);
    intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y = (auVar25._0_4_ + fVar37) * 0.25;
    uVar23 = vmovlps_avx(auVar68);
    intr.super_Interaction._60_4_ = SUB84(uVar23,0);
    intr.super_Interaction.mediumInterface._0_4_ = (undefined4)((ulong)uVar23 >> 0x20);
    intr.super_Interaction.mediumInterface._4_4_ = (fVar39 + fVar37) * 0.5;
    intr.super_Interaction.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits._0_4_ = (undefined4)*(undefined8 *)&this_00[4].high;
    intr.super_Interaction.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits._4_4_ = (undefined4)((ulong)*(undefined8 *)&this_00[4].high >> 0x20);
    intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.x = this_00[5].high;
    u[1] = (u0 + u[2]) * 0.5;
    u[0] = u0;
    lVar21 = 1;
    auVar60 = ZEXT1264(ZEXT812(0));
    do {
      fVar40 = u[lVar21 + -1];
      fVar38 = u[lVar21];
      fVar39 = this->common->width[1];
      auVar26 = ZEXT416((uint)this->common->width[0]);
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar39)),auVar26,
                                ZEXT416((uint)(1.0 - fVar40)));
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar39 * fVar38)),auVar26,
                                ZEXT416((uint)(1.0 - fVar38)));
      auVar25 = vmaxss_avx(auVar26,auVar25);
      fVar39 = (pSVar22->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
      fVar12 = (pSVar22->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      fVar59 = (pSVar22->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      FVar1 = (pSVar22->super_Interaction).time;
      auVar26 = vgatherdps_avx512vl(*(undefined4 *)
                                     ((long)&(pSVar22->super_Interaction).pi.
                                             super_Point3<pbrt::Interval<float>_>.
                                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
                                             low +
                                     (long)&((Tuple3<pbrt::Vector3,_float> *)
                                            &pPVar20->super_Tuple3<pbrt::Point3,_float>)->x));
      auVar27 = vgatherdps_avx512vl(*(undefined4 *)
                                     ((long)&(pSVar22->super_Interaction).pi.
                                             super_Point3<pbrt::Interval<float>_>.
                                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
                                             low +
                                     (long)&((Tuple3<pbrt::Vector3,_float> *)
                                            &pPVar20->super_Tuple3<pbrt::Point3,_float>)->x));
      fVar63 = auVar25._0_4_ * 0.5;
      fVar37 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar25 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar37 * fVar37)),auVar25,auVar25);
      auVar28 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar25 = vfmadd213ss_fma(auVar28,auVar28,auVar25);
      if (auVar25._0_4_ < 0.0) {
        local_298 = ZEXT416((uint)fVar63);
        local_2c8 = auVar26;
        local_2a4 = FVar1;
        local_2a0 = fVar59;
        local_29c = fVar12;
        fVar37 = sqrtf(auVar25._0_4_);
        auVar60 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar26 = local_2c8;
        fVar59 = local_2a0;
        FVar1 = local_2a4;
        fVar63 = (float)local_298._0_4_;
        fVar12 = local_29c;
      }
      else {
        auVar25 = vsqrtss_avx(auVar25,auVar25);
        fVar37 = auVar25._0_4_;
      }
      auVar29 = ZEXT416((uint)fVar39);
      auVar25 = vminss_avx(ZEXT416((uint)fVar12),auVar29);
      auVar28 = vminss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)FVar1));
      auVar25 = vminss_avx(auVar28,auVar25);
      bVar18 = false;
      if (auVar25._0_4_ - fVar63 <= 0.0) {
        auVar25 = vmaxss_avx(ZEXT416((uint)fVar12),auVar29);
        auVar28 = vmaxss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)FVar1));
        auVar25 = vmaxss_avx(auVar28,auVar25);
        if (0.0 <= fVar63 + auVar25._0_4_) {
          auVar28 = vmaxss_avx(ZEXT416((uint)(fVar37 * tMax)),auVar60._0_16_);
          auVar29 = vminss_avx(ZEXT416((uint)(fVar37 * tMax)),auVar60._0_16_);
          uVar15 = vcmpps_avx512vl(auVar26,auVar27,1);
          uVar23 = vcmpps_avx512vl(auVar27,auVar26,1);
          auVar25 = vpmovm2d_avx512vl(uVar23);
          auVar25 = vpshufd_avx(auVar25,0x4e);
          uVar24 = vpmovd2m_avx512vl(auVar25);
          auVar25 = vblendps_avx(auVar26,auVar27,6);
          auVar26 = vblendps_avx(auVar27,auVar26,6);
          auVar30 = vblendmps_avx512vl(auVar26,auVar25);
          bVar11 = (bool)((byte)uVar15 & 1);
          auVar31._0_4_ = (uint)bVar11 * auVar30._0_4_ | (uint)!bVar11 * auVar27._0_4_;
          bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar31._4_4_ = (uint)bVar11 * auVar30._4_4_ | (uint)!bVar11 * auVar27._4_4_;
          bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar31._8_4_ = (uint)bVar11 * auVar30._8_4_ | (uint)!bVar11 * auVar27._8_4_;
          bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar31._12_4_ = (uint)bVar11 * auVar30._12_4_ | (uint)!bVar11 * auVar27._12_4_;
          auVar25 = vshufpd_avx(auVar25,auVar25,1);
          auVar26 = vshufpd_avx(auVar26,auVar26,1);
          bVar11 = (bool)((byte)uVar24 & 1);
          auVar32._0_4_ = (uint)bVar11 * auVar25._0_4_ | (uint)!bVar11 * auVar26._0_4_;
          bVar11 = (bool)((byte)(uVar24 >> 1) & 1);
          auVar32._4_4_ = (uint)bVar11 * auVar25._4_4_ | (uint)!bVar11 * auVar26._4_4_;
          bVar11 = (bool)((byte)(uVar24 >> 2) & 1);
          auVar32._8_4_ = (uint)bVar11 * auVar25._8_4_ | (uint)!bVar11 * auVar26._8_4_;
          bVar11 = (bool)((byte)(uVar24 >> 3) & 1);
          auVar32._12_4_ = (uint)bVar11 * auVar25._12_4_ | (uint)!bVar11 * auVar26._12_4_;
          uVar15 = vcmpps_avx512vl(auVar31,auVar32,1);
          auVar25 = vblendps_avx(auVar31,auVar32,6);
          auVar26 = vblendps_avx(auVar32,auVar31,6);
          bVar11 = (bool)((byte)uVar15 & 1);
          auVar33._0_4_ = (float)((uint)bVar11 * auVar25._0_4_ | (uint)!bVar11 * auVar26._0_4_);
          bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar33._4_4_ = (float)((uint)bVar11 * auVar25._4_4_ | (uint)!bVar11 * auVar26._4_4_);
          bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar33._8_4_ = (float)((uint)bVar11 * auVar25._8_4_ | (uint)!bVar11 * auVar26._8_4_);
          bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar33._12_4_ = (float)((uint)bVar11 * auVar25._12_4_ | (uint)!bVar11 * auVar26._12_4_);
          auVar56._4_4_ = fVar63;
          auVar56._0_4_ = fVar63;
          auVar56._8_4_ = fVar63;
          auVar56._12_4_ = fVar63;
          auVar25 = vsubps_avx(auVar33,auVar56);
          auVar57._0_4_ = auVar33._0_4_ + fVar63;
          auVar57._4_4_ = auVar33._4_4_ + fVar63;
          auVar57._8_4_ = auVar33._8_4_ + fVar63;
          auVar57._12_4_ = auVar33._12_4_ + fVar63;
          auVar25 = vblendps_avx(auVar25,auVar57,6);
          auVar26 = vshufps_avx(ZEXT416(auVar29._0_4_),ZEXT416(auVar28._0_4_),0x11);
          uVar23 = vcmpps_avx512vl(auVar25,auVar26,2);
          uVar16 = vcmpps_avx512vl(auVar26,auVar25,2);
          auVar25 = vpmovm2d_avx512vl(uVar16);
          auVar26 = vpmovm2d_avx512vl(uVar23);
          auVar25 = vpblendd_avx2(auVar26,auVar25,6);
          uVar23 = vpmovd2m_avx512vl(auVar25);
          pPVar20 = (Point3<float> *)
                    CONCAT44((int)((ulong)pPVar20 >> 0x20),(uint)(ushort)~(ushort)uVar23);
          if ((~(ushort)uVar23 & 0xf) == 0) {
            cp_00.n = 4;
            cp_00.ptr = (Point3<float> *)pSVar22;
            pPVar20 = (Point3<float> *)0x4;
            bVar18 = RecursiveIntersect(this,ray,tMax,cp_00,local_2b0,fVar40,fVar38,depth + -1,si);
            auVar60 = ZEXT1664(ZEXT816(0) << 0x40);
            bVar18 = bVar18 && si == (optional<pbrt::ShapeIntersection> *)0x0;
          }
        }
      }
      if (bVar18) {
        return true;
      }
      lVar21 = lVar21 + 1;
      pSVar22 = (SurfaceInteraction *)
                &(pSVar22->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
    } while (lVar21 == 2);
    if (si != (optional<pbrt::ShapeIntersection> *)0x0) {
      return si->set;
    }
  }
  return false;
}

Assistant:

bool Curve::RecursiveIntersect(const Ray &ray, Float tMax, pstd::span<const Point3f> cp,
                               const Transform &ObjectFromRay, Float u0, Float u1,
                               int depth, pstd::optional<ShapeIntersection> *si) const {
    Float rayLength = Length(ray.d);
    if (depth > 0) {
        // Split curve segment into sub-segments and test for intersection
        pstd::array<Point3f, 7> cpSplit = SubdivideCubicBezier(cp);
        Float u[3] = {u0, (u0 + u1) / 2, u1};
        for (int seg = 0; seg < 2; ++seg) {
            // Check ray against curve segment's bounding box
            Float maxWidth =
                std::max(Lerp(u[seg], common->width[0], common->width[1]),
                         Lerp(u[seg + 1], common->width[0], common->width[1]));
            pstd::span<const Point3f> cps = pstd::MakeConstSpan(&cpSplit[3 * seg], 4);
            Bounds3f curveBounds =
                Union(Bounds3f(cps[0], cps[1]), Bounds3f(cps[2], cps[3]));
            curveBounds = Expand(curveBounds, 0.5f * maxWidth);
            Bounds3f rayBounds(Point3f(0, 0, 0), Point3f(0, 0, Length(ray.d) * tMax));
            if (!Overlaps(rayBounds, curveBounds))
                continue;

            // Recursively test ray-segment intersection
            bool hit = RecursiveIntersect(ray, tMax, cps, ObjectFromRay, u[seg],
                                          u[seg + 1], depth - 1, si);
            if (hit && si == nullptr)
                return true;
        }
        return si ? si->has_value() : false;

    } else {
        // Intersect ray with curve segment
        // Test ray against segment endpoint boundaries
        // Test sample point against tangent perpendicular at curve start
        Float edge = (cp[1].y - cp[0].y) * -cp[0].y + cp[0].x * (cp[0].x - cp[1].x);
        if (edge < 0)
            return false;

        // Test sample point against tangent perpendicular at curve end
        edge = (cp[2].y - cp[3].y) * -cp[3].y + cp[3].x * (cp[3].x - cp[2].x);
        if (edge < 0)
            return false;

        // Find line $w$ that gives minimum distance to sample point
        Vector2f segmentDir = Point2f(cp[3].x, cp[3].y) - Point2f(cp[0].x, cp[0].y);
        Float denom = LengthSquared(segmentDir);
        if (denom == 0)
            return false;
        Float w = Dot(-Vector2f(cp[0].x, cp[0].y), segmentDir) / denom;

        // Compute $u$ coordinate of curve intersection point and _hitWidth_
        Float u = Clamp(Lerp(w, u0, u1), u0, u1);
        Float hitWidth = Lerp(u, common->width[0], common->width[1]);
        Normal3f nHit;
        if (common->type == CurveType::Ribbon) {
            // Scale _hitWidth_ based on ribbon orientation
            Float sin0 =
                std::sin((1 - u) * common->normalAngle) * common->invSinNormalAngle;
            Float sin1 = std::sin(u * common->normalAngle) * common->invSinNormalAngle;
            nHit = sin0 * common->n[0] + sin1 * common->n[1];
            hitWidth *= AbsDot(nHit, ray.d) / rayLength;
        }

        // Test intersection point against curve width
        Vector3f dpcdw;
        Point3f pc =
            EvaluateCubicBezier(pstd::span<const Point3f>(cp), Clamp(w, 0, 1), &dpcdw);
        Float ptCurveDist2 = pc.x * pc.x + pc.y * pc.y;
        if (ptCurveDist2 > hitWidth * hitWidth * .25f)
            return false;
        if (pc.z < 0 || pc.z > rayLength * tMax)
            return false;

        if (si != nullptr) {
            // Initialize _ShapeIntersection_ for curve intersection
            // Compute _tHit_ for curve intersection
            // FIXME: this tHit isn't quite right for ribbons...
            Float tHit = pc.z / rayLength;
            if (si->has_value() && tHit > si->value().tHit)
                return false;

            // Initialize _SurfaceInteraction_ _intr_ for curve intersection
            // Compute $v$ coordinate of curve intersection point
            Float ptCurveDist = std::sqrt(ptCurveDist2);
            Float edgeFunc = dpcdw.x * -pc.y + pc.x * dpcdw.y;
            Float v = (edgeFunc > 0) ? 0.5f + ptCurveDist / hitWidth
                                     : 0.5f - ptCurveDist / hitWidth;

            // Compute $\dpdu$ and $\dpdv$ for curve intersection
            Vector3f dpdu, dpdv;
            EvaluateCubicBezier(pstd::MakeConstSpan(common->cpObj), u, &dpdu);
            CHECK_NE(Vector3f(0, 0, 0), dpdu);
            if (common->type == CurveType::Ribbon)
                dpdv = Normalize(Cross(nHit, dpdu)) * hitWidth;
            else {
                // Compute curve $\dpdv$ for flat and cylinder curves
                Vector3f dpduPlane = ObjectFromRay.ApplyInverse(dpdu);
                Vector3f dpdvPlane =
                    Normalize(Vector3f(-dpduPlane.y, dpduPlane.x, 0)) * hitWidth;
                if (common->type == CurveType::Cylinder) {
                    // Rotate _dpdvPlane_ to give cylindrical appearance
                    Float theta = Lerp(v, -90., 90.);
                    Transform rot = Rotate(-theta, dpduPlane);
                    dpdvPlane = rot(dpdvPlane);
                }
                dpdv = ObjectFromRay(dpdvPlane);
            }

            // Compute error bounds for curve intersection
            Vector3f pError(2 * hitWidth, 2 * hitWidth, 2 * hitWidth);

            bool flipNormal =
                common->reverseOrientation ^ common->transformSwapsHandedness;
            Point3fi pi(ray(tHit), pError);
            SurfaceInteraction intr(pi, {u, v}, -ray.d, dpdu, dpdv, Normal3f(),
                                    Normal3f(), ray.time, flipNormal);
            intr = (*common->renderFromObject)(intr);

            *si = ShapeIntersection{intr, tHit};
        }
#ifndef PBRT_IS_GPU_CODE
        ++nCurveHits;
#endif
        return true;
    }
}